

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk-abi-vla-internal.c
# Opt level: O1

void vla_free_from_original_stack(__cilkrts_stack_frame *sf,size_t full_size)

{
  if (sf->worker != (__cilkrts_worker *)0x0) {
    __cilkrts_adjust_stack(sf->worker->l->frame_ff,full_size);
    return;
  }
  vla_free_from_original_stack_cold_1();
}

Assistant:

void vla_free_from_original_stack(__cilkrts_stack_frame *sf,
                                  size_t full_size)
{
    // The __cilkrts_stack_frame must be initialized
    CILK_ASSERT(sf->worker);

#if 1
    // Add full_size to ff->sync_sp so that when we return, the VLA will no
    // longer be allocated on the stack
    __cilkrts_adjust_stack(sf->worker->l->frame_ff, full_size);
#else
    // Inline __cilkrts_adjust_stack for Kevin
    full_frame *ff = sf->worker->l->frame_ff;
    ff->sync_sp = ff->sync_sp + full_size;
#endif
}